

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall CMU462::Matrix4x4::inv(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double *pdVar18;
  double dVar19;
  Matrix4x4 *A;
  Matrix4x4 *this_local;
  Matrix4x4 *B;
  
  Matrix4x4(__return_storage_ptr__);
  pdVar18 = operator()(this,1,2);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,0,0);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,3);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,0,1);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,2);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,0,2);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,3);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,0,3);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,1,3);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,1,0);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,2);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,1,1);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,3);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,1,2);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,2);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,1,3);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,1,1);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,2,0);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,3);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,2,1);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,1);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,2,2);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,3);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,3);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,3);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,2,3);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,2,3);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,1,2);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,3,0);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,1);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,3,1);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,2);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,3,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,3,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,3,2);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,3,2);
  *pdVar18 = -(dVar15 * dVar16) * dVar17 +
             dVar12 * dVar13 * dVar14 +
             dVar9 * dVar10 * dVar11 +
             -(dVar6 * dVar7) * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  pdVar18 = operator()(this,0,1);
  dVar19 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar1 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar2 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar3 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar4 = *pdVar18;
  pdVar18 = operator()(this,2,0);
  dVar5 = *pdVar18;
  pdVar18 = operator()(this,0,2);
  dVar6 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar7 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar8 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar9 = *pdVar18;
  pdVar18 = operator()(this,1,2);
  dVar10 = *pdVar18;
  pdVar18 = operator()(this,2,1);
  dVar11 = *pdVar18;
  pdVar18 = operator()(this,0,1);
  dVar12 = *pdVar18;
  pdVar18 = operator()(this,1,0);
  dVar13 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar14 = *pdVar18;
  pdVar18 = operator()(this,0,0);
  dVar15 = *pdVar18;
  pdVar18 = operator()(this,1,1);
  dVar16 = *pdVar18;
  pdVar18 = operator()(this,2,2);
  dVar17 = *pdVar18;
  pdVar18 = operator()(__return_storage_ptr__,3,3);
  *pdVar18 = dVar15 * dVar16 * dVar17 +
             -(dVar12 * dVar13) * dVar14 +
             -(dVar9 * dVar10) * dVar11 +
             dVar6 * dVar7 * dVar8 + dVar19 * dVar1 * dVar2 + -(dVar3 * dVar4 * dVar5);
  dVar19 = det(this);
  operator/=(__return_storage_ptr__,dVar19);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::inv( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

	// Hardcoded in Fully Symbolic computation.

	B(0,0) = A(1,2)*A(2,3)*A(3,1) - A(1,3)*A(2,2)*A(3,1) + A(1,3)*A(2,1)*A(3,2) - A(1,1)*A(2,3)*A(3,2) - A(1,2)*A(2,1)*A(3,3) + A(1,1)*A(2,2)*A(3,3);
	B(0,1) = A(0,3)*A(2,2)*A(3,1) - A(0,2)*A(2,3)*A(3,1) - A(0,3)*A(2,1)*A(3,2) + A(0,1)*A(2,3)*A(3,2) + A(0,2)*A(2,1)*A(3,3) - A(0,1)*A(2,2)*A(3,3);
	B(0,2) = A(0,2)*A(1,3)*A(3,1) - A(0,3)*A(1,2)*A(3,1) + A(0,3)*A(1,1)*A(3,2) - A(0,1)*A(1,3)*A(3,2) - A(0,2)*A(1,1)*A(3,3) + A(0,1)*A(1,2)*A(3,3);
	B(0,3) = A(0,3)*A(1,2)*A(2,1) - A(0,2)*A(1,3)*A(2,1) - A(0,3)*A(1,1)*A(2,2) + A(0,1)*A(1,3)*A(2,2) + A(0,2)*A(1,1)*A(2,3) - A(0,1)*A(1,2)*A(2,3);
	B(1,0) = A(1,3)*A(2,2)*A(3,0) - A(1,2)*A(2,3)*A(3,0) - A(1,3)*A(2,0)*A(3,2) + A(1,0)*A(2,3)*A(3,2) + A(1,2)*A(2,0)*A(3,3) - A(1,0)*A(2,2)*A(3,3);
	B(1,1) = A(0,2)*A(2,3)*A(3,0) - A(0,3)*A(2,2)*A(3,0) + A(0,3)*A(2,0)*A(3,2) - A(0,0)*A(2,3)*A(3,2) - A(0,2)*A(2,0)*A(3,3) + A(0,0)*A(2,2)*A(3,3);
	B(1,2) = A(0,3)*A(1,2)*A(3,0) - A(0,2)*A(1,3)*A(3,0) - A(0,3)*A(1,0)*A(3,2) + A(0,0)*A(1,3)*A(3,2) + A(0,2)*A(1,0)*A(3,3) - A(0,0)*A(1,2)*A(3,3);
	B(1,3) = A(0,2)*A(1,3)*A(2,0) - A(0,3)*A(1,2)*A(2,0) + A(0,3)*A(1,0)*A(2,2) - A(0,0)*A(1,3)*A(2,2) - A(0,2)*A(1,0)*A(2,3) + A(0,0)*A(1,2)*A(2,3);
	B(2,0) = A(1,1)*A(2,3)*A(3,0) - A(1,3)*A(2,1)*A(3,0) + A(1,3)*A(2,0)*A(3,1) - A(1,0)*A(2,3)*A(3,1) - A(1,1)*A(2,0)*A(3,3) + A(1,0)*A(2,1)*A(3,3);
	B(2,1) = A(0,3)*A(2,1)*A(3,0) - A(0,1)*A(2,3)*A(3,0) - A(0,3)*A(2,0)*A(3,1) + A(0,0)*A(2,3)*A(3,1) + A(0,1)*A(2,0)*A(3,3) - A(0,0)*A(2,1)*A(3,3);
	B(2,2) = A(0,1)*A(1,3)*A(3,0) - A(0,3)*A(1,1)*A(3,0) + A(0,3)*A(1,0)*A(3,1) - A(0,0)*A(1,3)*A(3,1) - A(0,1)*A(1,0)*A(3,3) + A(0,0)*A(1,1)*A(3,3);
	B(2,3) = A(0,3)*A(1,1)*A(2,0) - A(0,1)*A(1,3)*A(2,0) - A(0,3)*A(1,0)*A(2,1) + A(0,0)*A(1,3)*A(2,1) + A(0,1)*A(1,0)*A(2,3) - A(0,0)*A(1,1)*A(2,3);
	B(3,0) = A(1,2)*A(2,1)*A(3,0) - A(1,1)*A(2,2)*A(3,0) - A(1,2)*A(2,0)*A(3,1) + A(1,0)*A(2,2)*A(3,1) + A(1,1)*A(2,0)*A(3,2) - A(1,0)*A(2,1)*A(3,2);
	B(3,1) = A(0,1)*A(2,2)*A(3,0) - A(0,2)*A(2,1)*A(3,0) + A(0,2)*A(2,0)*A(3,1) - A(0,0)*A(2,2)*A(3,1) - A(0,1)*A(2,0)*A(3,2) + A(0,0)*A(2,1)*A(3,2);
	B(3,2) = A(0,2)*A(1,1)*A(3,0) - A(0,1)*A(1,2)*A(3,0) - A(0,2)*A(1,0)*A(3,1) + A(0,0)*A(1,2)*A(3,1) + A(0,1)*A(1,0)*A(3,2) - A(0,0)*A(1,1)*A(3,2);
	B(3,3) = A(0,1)*A(1,2)*A(2,0) - A(0,2)*A(1,1)*A(2,0) + A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) - A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2);

	// Invertable iff the determinant is not equal to zero.
    B /= det();

    return B;
  }